

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetTXMarkerInfo(ndicapi *pol,int ph,int marker)

{
  unsigned_long uVar1;
  int local_2c;
  int n;
  int i;
  char *dp;
  int marker_local;
  int ph_local;
  ndicapi *pol_local;
  
  local_2c = 0;
  while ((local_2c < pol->TxHandleCount && ((uint)pol->TxHandles[local_2c] != ph))) {
    local_2c = local_2c + 1;
  }
  if ((local_2c == pol->TxHandleCount) || ((marker < 0 || (0x13 < marker)))) {
    pol_local._4_4_ = 1;
  }
  else {
    uVar1 = ndiHexToUnsignedLong(pol->TxInformation[marker + 2],1);
    pol_local._4_4_ = (int)uVar1;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetTXMarkerInfo(ndicapi* pol, int ph, int marker)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n || marker < 0 || marker >= 20)
  {
    return NDI_DISABLED;
  }

  dp = pol->TxInformation[2 + marker];
  return (int)ndiHexToUnsignedLong(dp, 1);
}